

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

void __thiscall MeCab::Viterbi::~Viterbi(Viterbi *this)

{
  ~Viterbi(this);
  operator_delete(this);
  return;
}

Assistant:

Viterbi::~Viterbi() {}